

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall
flatbuffers::ts::TsGenerator::GenStructBody
          (TsGenerator *this,StructDef *struct_def,string *body,string *nameprefix)

{
  BaseType BVar1;
  FieldDef *__rhs;
  StructDef *pSVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer ppFVar4;
  string class_name;
  allocator<char> local_16a;
  allocator<char> local_169;
  string fname;
  string pack_func_create_call;
  string str_last_item_idx;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::append((char *)body);
  NumToString<unsigned_long>(&fname,struct_def->minalign);
  std::operator+(&str_last_item_idx,&fname,", ");
  std::__cxx11::string::append((string *)body);
  std::__cxx11::string::~string((string *)&str_last_item_idx);
  std::__cxx11::string::~string((string *)&fname);
  NumToString<unsigned_long>(&fname,struct_def->bytesize);
  std::operator+(&str_last_item_idx,&fname,");\n");
  std::__cxx11::string::append((string *)body);
  std::__cxx11::string::~string((string *)&str_last_item_idx);
  std::__cxx11::string::~string((string *)&fname);
  ppFVar4 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    while( true ) {
      while( true ) {
        if (ppFVar4 ==
            (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          return;
        }
        __rhs = ppFVar4[-1];
        if (__rhs->padding != 0) {
          NumToString<unsigned_long>(&class_name,__rhs->padding);
          std::operator+(&fname,"  builder.pad(",&class_name);
          std::operator+(&str_last_item_idx,&fname,");\n");
          std::__cxx11::string::append((string *)body);
          std::__cxx11::string::~string((string *)&str_last_item_idx);
          std::__cxx11::string::~string((string *)&fname);
          std::__cxx11::string::~string((string *)&class_name);
        }
        ppFVar4 = ppFVar4 + -1;
        BVar1 = (__rhs->value).type.base_type;
        if (BVar1 == BASE_TYPE_STRUCT) break;
        if (BVar1 != BASE_TYPE_ARRAY) goto LAB_001d2013;
        BVar1 = (__rhs->value).type.element;
        if (BVar1 == BASE_TYPE_STRUCT) {
          NumToString<int>(&str_last_item_idx,(__rhs->value).type.fixed_length - 1);
          std::operator+(&pack_func_create_call,"\n  for (let i = ",&str_last_item_idx);
          std::operator+(&class_name,&pack_func_create_call,"; i >= 0; --i");
          std::operator+(&fname,&class_name,") {\n");
          std::__cxx11::string::append((string *)body);
          std::__cxx11::string::~string((string *)&fname);
          std::__cxx11::string::~string((string *)&class_name);
          std::__cxx11::string::~string((string *)&pack_func_create_call);
          if (nameprefix->_M_string_length == 0) {
            std::__cxx11::string::string((string *)&fname,(string *)__rhs);
          }
          else {
            std::operator+(&class_name,nameprefix,"_");
            std::operator+(&fname,&class_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            std::__cxx11::string::~string((string *)&class_name);
          }
          std::operator+(&pack_func_create_call,"    const item = ",&fname);
          std::operator+(&class_name,&pack_func_create_call,"?.[i];\n\n");
          std::__cxx11::string::append((string *)body);
          std::__cxx11::string::~string((string *)&class_name);
          std::__cxx11::string::~string((string *)&pack_func_create_call);
          if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
            GetTypeName_abi_cxx11_(&local_f0,this,(__rhs->value).type.struct_def,true,false);
            std::operator+(&pack_func_create_call,"    if (item instanceof ",&local_f0);
            std::operator+(&class_name,&pack_func_create_call,") {\n");
            std::__cxx11::string::append((string *)body);
            std::__cxx11::string::~string((string *)&class_name);
            std::__cxx11::string::~string((string *)&pack_func_create_call);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::append((char *)body);
            std::__cxx11::string::append((char *)body);
            std::__cxx11::string::append((char *)body);
          }
          std::operator+(&class_name,"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (__rhs->value).type.struct_def);
          std::operator+(&local_d0,&class_name,".create");
          std::operator+(&local_f0,&local_d0,&class_name);
          std::operator+(&pack_func_create_call,&local_f0,"(builder,\n");
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_d0);
          pSVar2 = (__rhs->value).type.struct_def;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"item",&local_169);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,",\n    ",&local_16a);
          GenStructMemberValueTS(&local_70,this,pSVar2,&local_b0,&local_90,false);
          std::operator+(&local_d0,"    ",&local_70);
          std::operator+(&local_f0,&local_d0,"\n  ");
          std::__cxx11::string::append((string *)&pack_func_create_call);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::operator+(&local_f0,"    ",&pack_func_create_call);
          std::__cxx11::string::append((string *)body);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::append((char *)body);
          std::__cxx11::string::~string((string *)&pack_func_create_call);
          std::__cxx11::string::~string((string *)&class_name);
          __return_storage_ptr__ = &fname;
          goto LAB_001d2692;
        }
        NumToString<int>(&str_last_item_idx,(__rhs->value).type.fixed_length - 1);
        if (nameprefix->_M_string_length == 0) {
          std::__cxx11::string::string((string *)&fname,(string *)__rhs);
        }
        else {
          std::operator+(&class_name,nameprefix,"_");
          std::operator+(&fname,&class_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          std::__cxx11::string::~string((string *)&class_name);
        }
        std::operator+(&pack_func_create_call,"\n  for (let i = ",&str_last_item_idx);
        std::operator+(&class_name,&pack_func_create_call,"; i >= 0; --i) {\n");
        std::__cxx11::string::append((string *)body);
        std::__cxx11::string::~string((string *)&class_name);
        std::__cxx11::string::~string((string *)&pack_func_create_call);
        std::__cxx11::string::append((char *)body);
        pack_func_create_call._M_dataplus._M_p._0_4_ = (__rhs->value).type.element;
        pack_func_create_call._4_8_ = 0;
        pack_func_create_call._12_6_ = 0;
        pack_func_create_call.field_2._M_allocated_capacity._2_2_ = 0;
        pack_func_create_call.field_2._4_6_ = 0;
        GenWriteMethod_abi_cxx11_(&class_name,this,(Type *)&pack_func_create_call);
        std::__cxx11::string::append((string *)body);
        std::__cxx11::string::~string((string *)&class_name);
        std::__cxx11::string::append((char *)body);
        std::__cxx11::string::append((char *)body);
        if (BVar1 - BASE_TYPE_LONG < 2) {
          std::operator+(&pack_func_create_call,"BigInt(",&fname);
          std::operator+(&class_name,&pack_func_create_call,"?.[i] ?? 0));\n");
          std::__cxx11::string::append((string *)body);
        }
        else {
          std::operator+(&pack_func_create_call,"(",&fname);
          std::operator+(&class_name,&pack_func_create_call,"?.[i] ?? 0));\n\n");
          std::__cxx11::string::append((string *)body);
        }
        std::__cxx11::string::~string((string *)&class_name);
        std::__cxx11::string::~string((string *)&pack_func_create_call);
        std::__cxx11::string::append((char *)body);
        std::__cxx11::string::~string((string *)&fname);
        std::__cxx11::string::~string((string *)&str_last_item_idx);
      }
      pSVar2 = (__rhs->value).type.struct_def;
      if (pSVar2->fixed != true) break;
      sVar3 = nameprefix->_M_string_length;
      if (sVar3 == 0) {
        std::__cxx11::string::string((string *)&str_last_item_idx,(string *)__rhs);
      }
      else {
        std::operator+(&local_50,nameprefix,"_");
        std::operator+(&str_last_item_idx,&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      }
      GenStructBody(this,pSVar2,body,&str_last_item_idx);
      std::__cxx11::string::~string((string *)&str_last_item_idx);
      if (sVar3 != 0) {
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
LAB_001d2013:
    if (nameprefix->_M_string_length == 0) {
      std::__cxx11::string::string((string *)&str_last_item_idx,(string *)__rhs);
    }
    else {
      std::operator+(&fname,nameprefix,"_");
      std::operator+(&str_last_item_idx,&fname,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::__cxx11::string::~string((string *)&fname);
    }
    GenWriteMethod_abi_cxx11_(&pack_func_create_call,this,&(__rhs->value).type);
    std::operator+(&class_name,"  builder.write",&pack_func_create_call);
    std::operator+(&fname,&class_name,"(");
    std::__cxx11::string::append((string *)body);
    std::__cxx11::string::~string((string *)&fname);
    std::__cxx11::string::~string((string *)&class_name);
    std::__cxx11::string::~string((string *)&pack_func_create_call);
    BVar1 = (__rhs->value).type.base_type;
    if (BVar1 - BASE_TYPE_LONG < 2) {
      std::operator+(&class_name,"BigInt(",&str_last_item_idx);
      std::operator+(&fname,&class_name," ?? 0));\n");
      std::__cxx11::string::append((string *)body);
LAB_001d215e:
      std::__cxx11::string::~string((string *)&fname);
      __return_storage_ptr__ = &class_name;
    }
    else {
      if (BVar1 == BASE_TYPE_BOOL) {
        std::operator+(&class_name,"Number(Boolean(",&str_last_item_idx);
        std::operator+(&fname,&class_name,")));\n");
        std::__cxx11::string::append((string *)body);
        goto LAB_001d215e;
      }
      __return_storage_ptr__ = &fname;
      std::operator+(__return_storage_ptr__,&str_last_item_idx,");\n");
      std::__cxx11::string::append((string *)body);
    }
LAB_001d2692:
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&str_last_item_idx);
  } while( true );
}

Assistant:

void GenStructBody(const StructDef &struct_def, std::string *body,
                     const std::string &nameprefix) {
    *body += "  builder.prep(";
    *body += NumToString(struct_def.minalign) + ", ";
    *body += NumToString(struct_def.bytesize) + ");\n";

    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding) {
        *body += "  builder.pad(" + NumToString(field.padding) + ");\n";
      }
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructBody(
            *field.value.type.struct_def, body,
            nameprefix.length() ? nameprefix + "_" + field.name : field.name);
      } else {
        auto element_type = field.value.type.element;

        if (field.value.type.base_type == BASE_TYPE_ARRAY) {
          switch (field.value.type.element) {
            case BASE_TYPE_STRUCT: {
              std::string str_last_item_idx =
                  NumToString(field.value.type.fixed_length - 1);
              *body += "\n  for (let i = " + str_last_item_idx +
                       "; i >= 0; --i" + ") {\n";

              std::string fname = nameprefix.length()
                                      ? nameprefix + "_" + field.name
                                      : field.name;

              *body += "    const item = " + fname + "?.[i];\n\n";

              if (parser_.opts.generate_object_based_api) {
                *body += "    if (item instanceof " +
                         GetTypeName(*field.value.type.struct_def,
                                     /*object_api =*/true) +
                         ") {\n";
                *body += "      item.pack(builder);\n";
                *body += "      continue;\n";
                *body += "    }\n\n";
              }

              std::string class_name =
                  GetPrefixedName(*field.value.type.struct_def);
              std::string pack_func_create_call =
                  class_name + ".create" + class_name + "(builder,\n";
              pack_func_create_call +=
                  "    " +
                  GenStructMemberValueTS(*field.value.type.struct_def, "item",
                                         ",\n    ", false) +
                  "\n  ";
              *body += "    " + pack_func_create_call;
              *body += "  );\n  }\n\n";

              break;
            }
            default: {
              std::string str_last_item_idx =
                  NumToString(field.value.type.fixed_length - 1);
              std::string fname = nameprefix.length()
                                      ? nameprefix + "_" + field.name
                                      : field.name;

              *body += "\n  for (let i = " + str_last_item_idx +
                       "; i >= 0; --i) {\n";
              *body += "    builder.write";
              *body += GenWriteMethod(
                  static_cast<flatbuffers::Type>(field.value.type.element));
              *body += "(";
              *body += element_type == BASE_TYPE_BOOL ? "+" : "";

              if (element_type == BASE_TYPE_LONG ||
                  element_type == BASE_TYPE_ULONG) {
                *body += "BigInt(" + fname + "?.[i] ?? 0));\n";
              } else {
                *body += "(" + fname + "?.[i] ?? 0));\n\n";
              }
              *body += "  }\n\n";
              break;
            }
          }
        } else {
          std::string fname =
              nameprefix.length() ? nameprefix + "_" + field.name : field.name;

          *body += "  builder.write" + GenWriteMethod(field.value.type) + "(";
          if (field.value.type.base_type == BASE_TYPE_BOOL) {
            *body += "Number(Boolean(" + fname + ")));\n";
            continue;
          } else if (field.value.type.base_type == BASE_TYPE_LONG ||
                     field.value.type.base_type == BASE_TYPE_ULONG) {
            *body += "BigInt(" + fname + " ?? 0));\n";
            continue;
          }

          *body += fname + ");\n";
        }
      }
    }
  }